

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O1

void ec_setupheader(void *p)

{
  *(undefined8 *)p = 0x101ffffffffffff;
  *(undefined4 *)((long)p + 8) = 0x1010101;
  *(undefined2 *)((long)p + 0xc) = 0xa488;
  return;
}

Assistant:

void ec_setupheader(void *p) 
{
   ec_etherheadert *bp;
   bp = p;
   bp->da0 = htons(0xffff);
   bp->da1 = htons(0xffff);
   bp->da2 = htons(0xffff);
   bp->sa0 = htons(priMAC[0]);
   bp->sa1 = htons(priMAC[1]);
   bp->sa2 = htons(priMAC[2]);
   bp->etype = htons(ETH_P_ECAT);
}